

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

uint32_t lzma_mf_find(lzma_mf *mf,uint32_t *count_ptr,lzma_match *matches)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  ulong uVar7;
  
  uVar1 = (*mf->find)(mf,matches);
  if (uVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = mf->nice_len;
    uVar7 = 0;
    do {
      if (uVar4 < matches[uVar7].len) {
        __assert_fail("matches[i].len <= mf->nice_len",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar5 = mf->read_pos;
      if (uVar5 <= matches[uVar7].dist) {
        __assert_fail("matches[i].dist < mf->read_pos",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x27,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      iVar2 = bcmp(mf->buffer + ((ulong)uVar5 - 1),
                   mf->buffer + ((ulong)uVar5 - (ulong)matches[uVar7].dist) + -2,
                   (ulong)matches[uVar7].len);
      if (iVar2 != 0) {
        __assert_fail("memcmp(mf_ptr(mf) - 1, mf_ptr(mf) - matches[i].dist - 2, matches[i].len) == 0"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x2a,"uint32_t lzma_mf_find(lzma_mf *, uint32_t *, lzma_match *)");
      }
      uVar7 = uVar7 + 1;
    } while (uVar1 != uVar7);
    uVar4 = matches[uVar1 - 1].len;
    uVar7 = (ulong)uVar4;
    if (uVar4 == mf->nice_len) {
      uVar5 = (mf->write_pos - mf->read_pos) + 1;
      if (mf->match_len_max <= uVar5) {
        uVar5 = mf->match_len_max;
      }
      if (uVar4 < uVar5) {
        puVar6 = mf->buffer + mf->read_pos + uVar7;
        do {
          uVar4 = (uint)uVar7;
          if (puVar6[-1] != puVar6[-2 - (ulong)matches[uVar1 - 1].dist]) break;
          uVar3 = (uint)uVar7 + 1;
          uVar7 = (ulong)uVar3;
          puVar6 = puVar6 + 1;
          uVar4 = uVar5;
        } while (uVar5 != uVar3);
      }
    }
  }
  *count_ptr = uVar1;
  mf->read_ahead = mf->read_ahead + 1;
  return uVar4;
}

Assistant:

extern uint32_t
lzma_mf_find(lzma_mf *mf, uint32_t *count_ptr, lzma_match *matches)
{
	// Call the match finder. It returns the number of length-distance
	// pairs found.
	// FIXME: Minimum count is zero, what _exactly_ is the maximum?
	const uint32_t count = mf->find(mf, matches);

	// Length of the longest match; assume that no matches were found
	// and thus the maximum length is zero.
	uint32_t len_best = 0;

	if (count > 0) {
#ifndef NDEBUG
		uint32_t i;
		// Validate the matches.
		for (i = 0; i < count; ++i) {
			assert(matches[i].len <= mf->nice_len);
			assert(matches[i].dist < mf->read_pos);
			assert(memcmp(mf_ptr(mf) - 1,
				mf_ptr(mf) - matches[i].dist - 2,
				matches[i].len) == 0);
		}
#endif

		// The last used element in the array contains
		// the longest match.
		len_best = matches[count - 1].len;

		// If a match of maximum search length was found, try to
		// extend the match to maximum possible length.
		if (len_best == mf->nice_len) {
			uint8_t *p1;
			uint8_t *p2;

			// The limit for the match length is either the
			// maximum match length supported by the LZ-based
			// encoder or the number of bytes left in the
			// dictionary, whichever is smaller.
			uint32_t limit = mf_avail(mf) + 1;
			if (limit > mf->match_len_max)
				limit = mf->match_len_max;

			// Pointer to the byte we just ran through
			// the match finder.
			p1 = mf_ptr(mf) - 1;

			// Pointer to the beginning of the match. We need -1
			// here because the match distances are zero based.
			p2 = p1 - matches[count - 1].dist - 1;

			while (len_best < limit
					&& p1[len_best] == p2[len_best])
				++len_best;
		}
	}

	*count_ptr = count;

	// Finally update the read position to indicate that match finder was
	// run for this dictionary offset.
	++mf->read_ahead;

	return len_best;
}